

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O1

bool clusterG2(TSimilarityMap *sim,TKeyPressCollection *keyPresses)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer psVar4;
  undefined1 (*pauVar5) [16];
  undefined1 auVar6 [16];
  TKeyPressCollection *pTVar7;
  TClusterId *ck;
  undefined1 (*pauVar8) [16];
  TClusterId *pTVar9;
  int iVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  long lVar13;
  undefined1 (*pauVar14) [16];
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 *puVar18;
  uint uVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> __i;
  ulong uVar22;
  float fVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vector<double,_std::allocator<double>_> nsum;
  undefined1 (*local_b0) [16];
  allocator_type local_a1;
  undefined1 (*local_a0) [16];
  ulong local_98;
  ulong local_90;
  TKeyPressCollection *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  undefined8 local_58;
  vector<double,_std::allocator<double>_> local_50;
  value_type_conflict2 local_38;
  
  auVar6 = _DAT_00115030;
  psVar4 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar16 = ((long)(keyPresses->
                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4) *
           -0x5555555555555555;
  uVar15 = (uint)uVar16;
  if ((int)uVar15 < 1) {
    uVar19 = 0;
  }
  else {
    uVar11 = (ulong)(uVar15 + 1 & 0xfffffffe);
    lVar13 = (ulong)(uVar15 & 0x7fffffff) - 1;
    auVar25._8_4_ = (int)lVar13;
    auVar25._0_8_ = lVar13;
    auVar25._12_4_ = (int)((ulong)lVar13 >> 0x20);
    pTVar9 = &psVar4[1].cid;
    auVar25 = auVar25 ^ _DAT_00115030;
    auVar26 = _DAT_00115020;
    do {
      auVar27 = auVar26 ^ auVar6;
      lVar13 = auVar26._8_8_;
      if ((bool)(~(auVar27._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar27._0_4_ ||
                  auVar25._4_4_ < auVar27._4_4_) & 1)) {
        pTVar9[-0xc] = (int)(auVar26._0_8_ + 1);
      }
      if ((auVar27._12_4_ != auVar25._12_4_ || auVar27._8_4_ <= auVar25._8_4_) &&
          auVar27._12_4_ <= auVar25._12_4_) {
        *pTVar9 = (TClusterId)(lVar13 + 1);
      }
      auVar26._0_8_ = auVar26._0_8_ + 2;
      auVar26._8_8_ = lVar13 + 2;
      pTVar9 = pTVar9 + 0x18;
      uVar11 = uVar11 - 2;
      uVar19 = uVar15;
    } while (uVar11 != 0);
  }
  local_38 = 1.0;
  local_88 = keyPresses;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,(long)((uVar16 << 0x20) + 0x100000000) >> 0x20,&local_38,&local_a1);
  local_90 = uVar16;
  if ((int)uVar15 < 2) {
    local_a0 = (undefined1 (*) [16])0x0;
    pauVar21 = (undefined1 (*) [16])0x0;
    local_b0 = (undefined1 (*) [16])0x0;
  }
  else {
    local_80 = (ulong)(uVar15 - 1);
    uVar16 = (ulong)(uVar15 & 0x7fffffff);
    uVar11 = 1;
    local_78 = 0;
    local_b0 = (undefined1 (*) [16])0x0;
    pauVar21 = (undefined1 (*) [16])0x0;
    local_a0 = (undefined1 (*) [16])0x0;
    local_68 = uVar16;
    do {
      lVar13 = local_78 * 3;
      uVar22 = local_78;
      local_98 = local_78;
      local_78 = local_78 + 1;
      local_70 = uVar11;
      local_60 = lVar13;
      do {
        uVar24 = *(undefined8 *)
                  (*(long *)((long)&(((sim->
                                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<stMatch,_std::allocator<stMatch>_>)._M_impl.
                                    super__Vector_impl_data + lVar13 * 8) + uVar11 * 0x10);
        if (pauVar21 == local_a0) {
          if ((long)pauVar21 - (long)local_b0 == 0x7ffffffffffffff0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar20 = (long)pauVar21 - (long)local_b0 >> 4;
          uVar16 = uVar20;
          if (pauVar21 == local_b0) {
            uVar16 = 1;
          }
          uVar17 = uVar16 + uVar20;
          if (0x7fffffffffffffe < uVar17) {
            uVar17 = 0x7ffffffffffffff;
          }
          if (CARRY8(uVar16,uVar20)) {
            uVar17 = 0x7ffffffffffffff;
          }
          if (uVar17 == 0) {
            pauVar8 = (undefined1 (*) [16])0x0;
          }
          else {
            local_58 = uVar24;
            pauVar8 = (undefined1 (*) [16])operator_new(uVar17 << 4);
            uVar22 = local_98;
            uVar24 = local_58;
          }
          *(int *)pauVar8[uVar20] = (int)uVar22;
          *(int *)(pauVar8[uVar20] + 4) = (int)uVar11;
          *(undefined8 *)(pauVar8[uVar20] + 8) = uVar24;
          pauVar12 = pauVar8;
          for (pauVar14 = local_b0; pauVar21 != pauVar14; pauVar14 = pauVar14 + 1) {
            uVar24 = *(undefined8 *)(*pauVar14 + 8);
            *(undefined8 *)*pauVar12 = *(undefined8 *)*pauVar14;
            *(undefined8 *)(*pauVar12 + 8) = uVar24;
            pauVar12 = pauVar12 + 1;
          }
          if (local_b0 != (undefined1 (*) [16])0x0) {
            operator_delete(local_b0,(long)local_a0 - (long)local_b0);
            uVar22 = local_98;
          }
          local_a0 = pauVar8 + uVar17;
          uVar16 = local_68;
          lVar13 = local_60;
          local_b0 = pauVar8;
        }
        else {
          *(int *)*pauVar21 = (int)uVar22;
          *(int *)(*pauVar21 + 4) = (int)uVar11;
          *(undefined8 *)(*pauVar21 + 8) = uVar24;
          pauVar12 = pauVar21;
        }
        pauVar21 = pauVar12 + 1;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar16);
      uVar11 = local_70 + 1;
    } while (local_78 != local_80);
  }
  if (local_b0 != pauVar21) {
    uVar16 = (long)pauVar21 - (long)local_b0 >> 4;
    lVar13 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_b0,pauVar21,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pauVar21 - (long)local_b0 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (local_b0,pauVar21);
    }
    else {
      pauVar8 = local_b0 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (local_b0,pauVar8);
      for (; pauVar8 != pauVar21; pauVar8 = pauVar8 + 1) {
        uVar24 = *(undefined8 *)*pauVar8;
        dVar1 = *(double *)(*pauVar8 + 8);
        pauVar12 = pauVar8;
        pauVar14 = pauVar8;
        if (*(double *)(pauVar8[-1] + 8) <= dVar1 && dVar1 != *(double *)(pauVar8[-1] + 8)) {
          do {
            pauVar12 = pauVar14 + -1;
            *pauVar14 = pauVar14[-1];
            pauVar5 = pauVar14 + -2;
            pauVar14 = pauVar12;
          } while (*(double *)(*pauVar5 + 8) <= dVar1 && dVar1 != *(double *)(*pauVar5 + 8));
        }
        *(undefined8 *)*pauVar12 = uVar24;
        *(double *)(*pauVar12 + 8) = dVar1;
      }
    }
  }
  puts("[+] Top 10 pairs");
  pTVar7 = local_88;
  puVar18 = (undefined8 *)(*local_b0 + 8);
  uVar16 = 0;
  do {
    printf("    Pair %d: %d %d %g\n",*puVar18,uVar16 & 0xffffffff,(ulong)*(uint *)(puVar18 + -1),
           (ulong)*(uint *)((long)puVar18 + -4));
    uVar16 = uVar16 + 1;
    puVar18 = puVar18 + 2;
  } while (uVar16 != 10);
  uVar16 = (ulong)((long)pauVar21 - (long)local_b0) >> 4;
  if (0 < (int)uVar16) {
    local_98 = local_90 & 0x7fffffff;
    uVar22 = 0;
    uVar11 = local_90;
    do {
      fVar23 = frand();
      pauVar21 = local_b0 + uVar22;
      iVar10 = 0;
      if ((double)fVar23 <= *(double *)(*pauVar21 + 8)) {
        if (0.5 <= *(double *)(*pauVar21 + 8)) {
          iVar2 = *(int *)*pauVar21;
          psVar4 = (pTVar7->
                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar3 = *(int *)(*pauVar21 + 4);
          if (psVar4[iVar2].cid != psVar4[iVar3].cid) {
            pTVar9 = &psVar4[iVar2].cid;
            if (psVar4[iVar3].cid < psVar4[iVar2].cid) {
              pTVar9 = &psVar4[iVar3].cid;
            }
            if (0 < (int)uVar11) {
              iVar10 = *pTVar9;
              pTVar9 = &psVar4->cid;
              uVar20 = local_98;
              do {
                if ((*pTVar9 == psVar4[iVar2].cid) || (*pTVar9 == psVar4[iVar3].cid)) {
                  *pTVar9 = iVar10;
                }
                pTVar9 = pTVar9 + 0xc;
                uVar20 = uVar20 - 1;
              } while (uVar20 != 0);
            }
            uVar19 = uVar19 - 1;
            printf("Clusters %3d %5.4f:",(ulong)uVar19);
            if (0 < (int)uVar11) {
              lVar13 = 0x20;
              uVar11 = local_98;
              do {
                printf(" %3d",(ulong)*(uint *)((long)&(((pTVar7->
                                                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                  ).
                                                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  waveform).samples + lVar13));
                lVar13 = lVar13 + 0x30;
                uVar11 = uVar11 - 1;
              } while (uVar11 != 0);
            }
            putchar(10);
            uVar11 = local_90;
            iVar10 = 0;
            if (uVar19 == 0x38) {
              iVar10 = 0xe;
            }
          }
        }
        else {
          iVar10 = 0xe;
        }
      }
    } while ((iVar10 == 0) && (uVar22 = uVar22 + 1, uVar22 != (uVar16 & 0x7fffffff)));
  }
  if (local_b0 != (undefined1 (*) [16])0x0) {
    operator_delete(local_b0,(long)local_a0 - (long)local_b0);
  }
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool clusterG2(TSimilarityMap & sim, TKeyPressCollection & keyPresses) {
    struct Pair {
        int i = -1;
        int j = -1;
        TValueCC cc = -1.0;

        bool operator < (const Pair & a) const { return cc > a.cc; }
    };

    int n = keyPresses.size();

    int nclusters = 0;
    for (int i = 0; i < n; ++i) {
        auto & ci = keyPresses[i].cid;

        ci = i + 1;
        ++nclusters;
    }

    std::vector<double> nsum(n + 1, 1.0);
    std::vector<Pair> ccpairs;
    for (int i = 0; i < n - 1; ++i) {
        for (int j = i + 1; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            ccpairs.emplace_back(Pair{i, j, cc});
        }
    }

    std::sort(ccpairs.begin(), ccpairs.end());

    printf("[+] Top 10 pairs\n");
    for (int i = 0; i < 10; ++i) {
        printf("    Pair %d: %d %d %g\n", i, ccpairs[i].i, ccpairs[i].j, ccpairs[i].cc);
    }

    int npairs = ccpairs.size();
    for (int ip = 0; ip < npairs; ++ip) {
        auto & curpair = ccpairs[ip];
        if (frand() > curpair.cc) continue;
        if (curpair.cc < 0.50) break;

        auto & ci = keyPresses[curpair.i].cid;
        auto & cj = keyPresses[curpair.j].cid;

        if (ci == cj) continue;
        auto cnew = std::min(ci, cj);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            if (ck == ci || ck == cj) ck = cnew;
        }
        --nclusters;

        printf("Clusters %3d %5.4f:", nclusters, curpair.cc);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            printf(" %3d", ck);
        }
        printf("\n");

        if (nclusters == 56) break;
    }

    return true;
}